

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_duplicate_Test::~expr_duplicate_Test(expr_duplicate_Test *this)

{
  expr_duplicate_Test *this_local;
  
  ~expr_duplicate_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(expr, duplicate) {
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 10);
    auto &b = mod.var("b", 10);
    auto &c = a.duplicate(4);
    auto &d = a.concat(b).duplicate(4);
    auto &e = mod.parameter("p", 4);
    e.set_value(10);
    auto &f = a.duplicate(e.as<Param>());

    EXPECT_EQ(c.to_string(), "{32'h4{a}}");
    EXPECT_EQ(d.to_string(), "{32'h4{a, b}}");
    EXPECT_EQ(f.to_string(), "{p{a}}");
}